

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O1

void fld_inv(limb_t *res,limb_t *z)

{
  uint uVar1;
  fld_t t1;
  fld_t t0;
  fld_t z2_50_0;
  fld_t z2_10_0;
  fld_t z2_100_0;
  fld_t z2_20_0;
  fld_t z11;
  fld_t z2_5_0;
  fld_t z9;
  fld_t z2;
  limb_t alStack_208 [6];
  limb_t local_1d8 [6];
  limb_t local_1a8 [6];
  limb_t local_178 [6];
  limb_t local_148 [6];
  limb_t local_118 [6];
  limb_t local_e8 [6];
  limb_t local_b8 [6];
  limb_t local_88 [6];
  limb_t local_58 [5];
  
  fld_sq(local_58,z);
  fld_sq(alStack_208,local_58);
  fld_sq(local_1d8,alStack_208);
  fld_mul(local_88,local_1d8,z);
  fld_mul(local_e8,local_88,local_58);
  fld_sq(local_1d8,local_e8);
  fld_mul(local_b8,local_1d8,local_88);
  fld_sq(local_1d8,local_b8);
  fld_sq(alStack_208,local_1d8);
  fld_sq(local_1d8,alStack_208);
  fld_sq(alStack_208,local_1d8);
  fld_sq(local_1d8,alStack_208);
  fld_mul(local_178,local_1d8,local_b8);
  fld_sq(local_1d8,local_178);
  fld_sq(alStack_208,local_1d8);
  uVar1 = 0;
  do {
    fld_sq(local_1d8,alStack_208);
    fld_sq(alStack_208,local_1d8);
    uVar1 = uVar1 + 2;
  } while (uVar1 < 8);
  fld_mul(local_118,alStack_208,local_178);
  fld_sq(local_1d8,local_118);
  fld_sq(alStack_208,local_1d8);
  uVar1 = 0;
  do {
    fld_sq(local_1d8,alStack_208);
    fld_sq(alStack_208,local_1d8);
    uVar1 = uVar1 + 2;
  } while (uVar1 < 0x12);
  fld_mul(local_1d8,alStack_208,local_118);
  fld_sq(alStack_208,local_1d8);
  fld_sq(local_1d8,alStack_208);
  uVar1 = 0;
  do {
    fld_sq(alStack_208,local_1d8);
    fld_sq(local_1d8,alStack_208);
    uVar1 = uVar1 + 2;
  } while (uVar1 < 8);
  fld_mul(local_1a8,local_1d8,local_178);
  fld_sq(local_1d8,local_1a8);
  fld_sq(alStack_208,local_1d8);
  uVar1 = 0;
  do {
    fld_sq(local_1d8,alStack_208);
    fld_sq(alStack_208,local_1d8);
    uVar1 = uVar1 + 2;
  } while (uVar1 < 0x30);
  fld_mul(local_148,alStack_208,local_1a8);
  fld_sq(alStack_208,local_148);
  fld_sq(local_1d8,alStack_208);
  uVar1 = 0;
  do {
    fld_sq(alStack_208,local_1d8);
    fld_sq(local_1d8,alStack_208);
    uVar1 = uVar1 + 2;
  } while (uVar1 < 0x62);
  fld_mul(alStack_208,local_1d8,local_148);
  fld_sq(local_1d8,alStack_208);
  fld_sq(alStack_208,local_1d8);
  uVar1 = 0;
  do {
    fld_sq(local_1d8,alStack_208);
    fld_sq(alStack_208,local_1d8);
    uVar1 = uVar1 + 2;
  } while (uVar1 < 0x30);
  fld_mul(local_1d8,alStack_208,local_1a8);
  fld_sq(alStack_208,local_1d8);
  fld_sq(local_1d8,alStack_208);
  fld_sq(alStack_208,local_1d8);
  fld_sq(local_1d8,alStack_208);
  fld_sq(alStack_208,local_1d8);
  fld_mul(res,alStack_208,local_e8);
  return;
}

Assistant:

void
fld_inv(fld_t res, const fld_t z)
{
	fld_t z2;
	fld_t z9;
	fld_t z11;
	fld_t z2_5_0;
	fld_t z2_10_0;
	fld_t z2_20_0;
	fld_t z2_50_0;
	fld_t z2_100_0;
	fld_t t0;
	fld_t t1;
	int i;

	/* 2 */ fld_sq(z2, z);
	/* 4 */ fld_sq(t1, z2);
	/* 8 */ fld_sq(t0, t1);
	/* 9 */ fld_mul(z9,t0, z);
	/* 11 */ fld_mul(z11, z9, z2);
	/* 22 */ fld_sq(t0, z11);
	/* 2^5 - 2^0 = 31 */ fld_mul(z2_5_0, t0, z9);

	/* 2^6 - 2^1 */ fld_sq(t0, z2_5_0);
	/* 2^7 - 2^2 */ fld_sq(t1, t0);
	/* 2^8 - 2^3 */ fld_sq(t0, t1);
	/* 2^9 - 2^4 */ fld_sq(t1, t0);
	/* 2^10 - 2^5 */ fld_sq(t0, t1);
	/* 2^10 - 2^0 */ fld_mul(z2_10_0, t0, z2_5_0);

	/* 2^11 - 2^1 */ fld_sq(t0, z2_10_0);
	/* 2^12 - 2^2 */ fld_sq(t1, t0);
	/* 2^20 - 2^10 */ for (i = 2; i < 10; i += 2) { fld_sq(t0, t1); fld_sq(t1, t0); }
	/* 2^20 - 2^0 */ fld_mul(z2_20_0, t1, z2_10_0);

	/* 2^21 - 2^1 */ fld_sq(t0, z2_20_0);
	/* 2^22 - 2^2 */ fld_sq(t1, t0);
	/* 2^40 - 2^20 */ for (i = 2;i < 20;i += 2) { fld_sq(t0, t1); fld_sq(t1, t0); }
	/* 2^40 - 2^0 */ fld_mul(t0, t1, z2_20_0);

	/* 2^41 - 2^1 */ fld_sq(t1, t0);
	/* 2^42 - 2^2 */ fld_sq(t0, t1);
	/* 2^50 - 2^10 */ for (i = 2; i < 10; i += 2) { fld_sq(t1, t0); fld_sq(t0, t1); }
	/* 2^50 - 2^0 */ fld_mul(z2_50_0, t0, z2_10_0);

	/* 2^51 - 2^1 */ fld_sq(t0, z2_50_0);
	/* 2^52 - 2^2 */ fld_sq(t1, t0);
	/* 2^100 - 2^50 */ for (i = 2; i < 50; i += 2) { fld_sq(t0, t1); fld_sq(t1, t0); }
	/* 2^100 - 2^0 */ fld_mul(z2_100_0, t1, z2_50_0);

	/* 2^101 - 2^1 */ fld_sq(t1, z2_100_0);
	/* 2^102 - 2^2 */ fld_sq(t0, t1);
	/* 2^200 - 2^100 */ for (i = 2; i < 100; i += 2) { fld_sq(t1, t0); fld_sq(t0, t1); }
	/* 2^200 - 2^0 */ fld_mul(t1, t0, z2_100_0);

	/* 2^201 - 2^1 */ fld_sq(t0, t1);
	/* 2^202 - 2^2 */ fld_sq(t1, t0);
	/* 2^250 - 2^50 */ for (i = 2; i < 50; i += 2) { fld_sq(t0, t1); fld_sq(t1, t0); }
	/* 2^250 - 2^0 */ fld_mul(t0, t1, z2_50_0);

	/* 2^251 - 2^1 */ fld_sq(t1, t0);
	/* 2^252 - 2^2 */ fld_sq(t0, t1);
	
	/* 2^253 - 2^3 */ fld_sq(t1, t0);
	/* 2^254 - 2^4 */ fld_sq(t0, t1);
	/* 2^255 - 2^5 */ fld_sq(t1, t0);
	/* 2^255 - 21 */ fld_mul(res, t1, z11);
}